

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# narpc_namenode_client.cc
# Opt level: O2

Future<IoctlResponse> * __thiscall
NarpcNamenodeClient::Ioctl
          (Future<IoctlResponse> *__return_storage_ptr__,NarpcNamenodeClient *this,uchar op,
          Filename *name)

{
  int iVar1;
  shared_ptr<NarpcIoctlResponse> response;
  shared_ptr<IoctlRequest> request;
  undefined1 local_81 [9];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<IoctlRequest,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<AsyncTask<IoctlResponse>,(__gnu_cxx::_Lock_policy)2> local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<RpcMessage,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<RpcMessage,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  RpcClient *local_30;
  
  local_81[0] = op;
  std::make_shared<IoctlRequest,unsigned_char&,crail::Filename&>
            ((uchar *)&local_70,(Filename *)local_81);
  local_30 = &this->rpc_client_;
  std::make_shared<NarpcIoctlResponse,RpcClient*>((RpcClient **)(local_81 + 1));
  std::__shared_ptr<RpcMessage,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<IoctlRequest,void>
            (local_40,&local_70);
  std::__shared_ptr<RpcMessage,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<NarpcIoctlResponse,void>
            (local_50,(__shared_ptr<NarpcIoctlResponse,_(__gnu_cxx::_Lock_policy)2> *)(local_81 + 1)
            );
  iVar1 = RpcClient::IssueRequest
                    (&this->rpc_client_,(shared_ptr<RpcMessage> *)local_40,
                     (shared_ptr<RpcMessage> *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  if (iVar1 < 0) {
    Future<IoctlResponse>::Future(__return_storage_ptr__);
  }
  else {
    std::__shared_ptr<AsyncTask<IoctlResponse>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<NarpcIoctlResponse,void>
              (local_60,(__shared_ptr<NarpcIoctlResponse,_(__gnu_cxx::_Lock_policy)2> *)
                        (local_81 + 1));
    Future<IoctlResponse>::Future
              (__return_storage_ptr__,(shared_ptr<AsyncTask<IoctlResponse>_> *)local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Future<IoctlResponse> NarpcNamenodeClient::Ioctl(unsigned char op,
                                                 Filename &name) {
  shared_ptr<IoctlRequest> request = make_shared<IoctlRequest>(op, name);
  shared_ptr<NarpcIoctlResponse> response =
      make_shared<NarpcIoctlResponse>(&rpc_client_);

  if (rpc_client_.IssueRequest(request, response) < 0) {
    return Future<IoctlResponse>::Failure();
  }
  return Future<IoctlResponse>(response);
}